

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_test.cc
# Opt level: O2

void twohash_test(void)

{
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  time_t tVar4;
  long lVar5;
  uint64_t a;
  int iVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  timeval __test_begin;
  uint auStack_128 [66];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  for (a = 100; a != 0x6c; a = a + 1) {
    for (uVar8 = 0x14d; uVar8 != 0x155; uVar8 = uVar8 + 1) {
      uVar1 = hash_shuffle_2uint(a,uVar8);
      printf("(%d,%d) = %u\n",a & 0xffffffff,uVar8 & 0xffffffff,(ulong)uVar1);
    }
  }
  for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 1) {
    auStack_128[lVar5] = 0;
  }
  for (iVar6 = 0; iVar6 != 1000; iVar6 = iVar6 + 1) {
    iVar7 = 1000;
    while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
      iVar2 = rand();
      iVar3 = rand();
      uVar1 = hash_shuffle_2uint((long)(iVar2 % 0x8000),(long)(iVar3 % 0x8000));
      auStack_128[uVar1 & 0x3f] = auStack_128[uVar1 & 0x3f] + 1;
    }
  }
  for (uVar8 = 0; uVar8 != 0x40; uVar8 = uVar8 + 1) {
    printf("%d %d\n",uVar8 & 0xffffffff,(ulong)auStack_128[uVar8]);
  }
  fprintf(_stderr,"%s PASSED\n","two-integer hash test");
  return;
}

Assistant:

void twohash_test()
{
    TEST_INIT();

    randomize();

    int n = 64;
    int i,j;
    uint32_t h;
    int *array = alca(int, n);

    for (i=100;i<108;++i) {
        for (j=333;j<341;++j){
            printf("(%d,%d) = %u\n", i, j, hash_shuffle_2uint(i,j));
        }
    }
    for (i=0;i<n;++i) array[i] = 0;
    for (i=0;i<1000;++i) {
        for (j=0;j<1000;++j){
            h = hash_shuffle_2uint(random(32768), random(32768)) & (uint32_t)(n-1);
            array[h]++;
        }
    }
    for (i=0;i<n;++i) {
        DBG("%d %d\n",i,array[i]);
    }

    TEST_RESULT("two-integer hash test");
}